

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_free_prevline(void)

{
  if (ngp_prevline.line != (char *)0x0) {
    free(ngp_prevline.line);
    ngp_prevline.line = (char *)0x0;
    ngp_prevline.name = (char *)0x0;
    ngp_prevline.value = (char *)0x0;
    ngp_prevline.comment = (char *)0x0;
    ngp_prevline.type = 0;
    ngp_prevline.format = 0;
    ngp_prevline.flags = 0;
  }
  return 0;
}

Assistant:

int	ngp_free_prevline(void)
 {
   if (NULL != ngp_prevline.line)
     { ngp_free(ngp_prevline.line);
       ngp_prevline.line = NULL;
       ngp_prevline.name = NULL;
       ngp_prevline.value = NULL;
       ngp_prevline.comment = NULL;
       ngp_prevline.type = NGP_TTYPE_UNKNOWN;
       ngp_prevline.format = NGP_FORMAT_OK;
       ngp_prevline.flags = 0;
     }
   return(NGP_OK);
 }